

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.hpp
# Opt level: O1

bool __thiscall
Diligent::RenderPassCache::RenderPassCacheKey::operator==
          (RenderPassCacheKey *this,RenderPassCacheKey *rhs)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  sVar2 = GetHash(this);
  sVar3 = GetHash(rhs);
  if (((((sVar2 == sVar3) &&
        (uVar4 = (ulong)this->NumRenderTargets, this->NumRenderTargets == rhs->NumRenderTargets)) &&
       (this->SampleCount == rhs->SampleCount)) &&
      ((this->EnableVRS == rhs->EnableVRS && (this->DSVFormat == rhs->DSVFormat)))) &&
     (this->ReadOnlyDSV == rhs->ReadOnlyDSV)) {
    bVar6 = uVar4 == 0;
    if ((!bVar6) && (this->RTVFormats[0] == rhs->RTVFormats[0])) {
      lVar1 = 0;
      do {
        lVar5 = lVar1;
        if (uVar4 - 1 == lVar5) break;
        lVar1 = lVar5 + 1;
      } while (this->RTVFormats[lVar5 + 1] == rhs->RTVFormats[lVar5 + 1]);
      bVar6 = uVar4 <= lVar5 + 1U;
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool operator==(const RenderPassCacheKey& rhs) const noexcept
        {
            // clang-format off
            if (GetHash()        != rhs.GetHash()        ||
                NumRenderTargets != rhs.NumRenderTargets ||
                SampleCount      != rhs.SampleCount      ||
                EnableVRS        != rhs.EnableVRS        ||
                DSVFormat        != rhs.DSVFormat        ||
                ReadOnlyDSV      != rhs.ReadOnlyDSV)
            {
                return false;
            }
            // clang-format on

            for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
                if (RTVFormats[rt] != rhs.RTVFormats[rt])
                    return false;

            return true;
        }